

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

int Cudd_ApaPrintDensity(FILE *fp,DdManager *dd,DdNode *node,int nvars)

{
  uint divisor;
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  DdApaNumber dividend;
  DdApaNumber quotient;
  int digits;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  dividend = Cudd_ApaCountMinterm(dd,node,nvars,&local_34);
  if (dividend == (DdApaNumber)0x0) {
    iVar2 = 0;
  }
  else {
    divisor = Cudd_DagSize(node);
    quotient = Cudd_NewApaNumber(local_34);
    uVar1 = Cudd_ApaIntDivision(local_34,dividend,divisor,quotient);
    iVar2 = Cudd_ApaPrintDecimal(fp,local_34,quotient);
    free(dividend);
    free(quotient);
    iVar3 = fprintf((FILE *)fp,".%u\n",(long)(((double)uVar1 / (double)divisor) * 1000000.0));
    if (iVar3 == -1) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
Cudd_ApaPrintDensity(
  FILE * fp,
  DdManager * dd,
  DdNode * node,
  int  nvars)
{
    int digits;
    int result;
    DdApaNumber count,density;
    unsigned int size, remainder, fractional;

    count = Cudd_ApaCountMinterm(dd,node,nvars,&digits);
    if (count == NULL)
        return(0);
    size = Cudd_DagSize(node);
    density = Cudd_NewApaNumber(digits);
    remainder = Cudd_ApaIntDivision(digits,count,size,density);
    result = Cudd_ApaPrintDecimal(fp,digits,density);
    ABC_FREE(count);
    ABC_FREE(density);
    fractional = (unsigned int)((double)remainder / size * 1000000);
    if (fprintf(fp,".%u\n", fractional) == EOF) {
        return(0);
    }
    return(result);

}